

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O0

int grad_fd(custom_function *funcpt,custom_gradient *funcgrad,double *x,int N,double *dx,double eps2
           ,double *f)

{
  int local_44;
  int retval;
  double *f_local;
  double eps2_local;
  double *dx_local;
  int N_local;
  double *x_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  local_44 = 0;
  if (funcgrad == (custom_gradient *)0x0) {
    local_44 = grad_calc(funcpt,x,N,dx,eps2,f);
  }
  else {
    (*funcgrad->funcgrad)(x,N,f,funcgrad->params);
  }
  return local_44;
}

Assistant:

int grad_fd(custom_function *funcpt, custom_gradient *funcgrad, double *x, int N, double *dx,
		double eps2, double *f) {
	int retval;
	retval = 0;
	if (funcgrad == NULL) {
		//printf("FD Gradient \n");
		retval = grad_calc(funcpt,x,N,dx,eps2,f);
	} else {
		//printf("Analytic gradient \n");
		FUNCGRAD_EVAL(funcgrad,x,N,f);
	}

	return retval;

}